

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Minefield_Query_PDU::calcPadding(Minefield_Query_PDU *this)

{
  KUINT16 *pKVar1;
  bool bVar2;
  
  if (this->m_bNeedsPadding == true) {
    pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 - 2;
  }
  bVar2 = (this->m_ui8NumSensTyp & 1) != 0;
  if (bVar2) {
    pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 2;
  }
  this->m_bNeedsPadding = bVar2;
  return;
}

Assistant:

void Minefield_Query_PDU::calcPadding()
{
    // Do we need to pad the PDU?
    // The PDU should be aligned to a 32 bit / 4 octet boundary.
    // We will either need 2 octet pad or 0 depending on how many perimeter points are included.
    if( m_bNeedsPadding )
    {
        m_ui16PDULength -= 2;
    }

    KUINT8 ui8PaddingNeeded = m_ui8NumSensTyp % 2;

    if( ui8PaddingNeeded )
    {
        m_bNeedsPadding = true;
        m_ui16PDULength += 2;
    }
    else
    {
        m_bNeedsPadding = false;
    }
}